

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O1

double __thiscall
FactoredDecPOMDPDiscrete::GetReward(FactoredDecPOMDPDiscrete *this,Index sI,Index jaI)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  double in_XMM0_Qa;
  double dVar4;
  double local_28;
  
  if (this->_m_cached_FlatRM == false) {
    lVar1 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates).
                                   super_MultiAgentDecisionProcess + 0x278))(this);
    if (lVar1 == 0) {
      local_28 = 0.0;
    }
    else {
      local_28 = 0.0;
      uVar3 = 0;
      do {
        dVar4 = (double)(**(code **)(*(long *)&(this->
                                               super_MultiAgentDecisionProcessDiscreteFactoredStates
                                               ).super_MultiAgentDecisionProcess + 0x268))
                                  (this,uVar3,sI,jaI);
        local_28 = local_28 + dVar4;
        uVar3 = (ulong)((int)uVar3 + 1);
        uVar2 = (**(code **)(*(long *)&(this->super_MultiAgentDecisionProcessDiscreteFactoredStates)
                                       .super_MultiAgentDecisionProcess + 0x278))(this);
      } while (uVar3 < uVar2);
    }
    return local_28;
  }
  (**(this->_m_p_rModel->super_RewardModelDiscreteInterface).super_QTableInterface.
     _vptr_QTableInterface)(this->_m_p_rModel,sI,(ulong)jaI);
  return in_XMM0_Qa;
}

Assistant:

double FactoredDecPOMDPDiscrete::GetReward(Index sI, Index jaI) const
{
    if(_m_cached_FlatRM)
        return _m_p_rModel->Get(sI,jaI);

    //sum over local reward functions
    double r = 0.0;
    for(Index e=0; e < GetNrLRFs(); e++)
    {
        double this_e_r = GetLRFRewardFlat(e, sI, jaI);
        r += this_e_r;
    }
    return(r);
}